

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_fill_rect_multi_color
               (nk_draw_list *list,nk_rect rect,nk_color left,nk_color top,nk_color right,
               nk_color bottom)

{
  nk_convert_config *config;
  uint uVar1;
  nk_vec2 pos;
  nk_vec2 pos_00;
  void *pvVar2;
  nk_draw_index *pnVar3;
  nk_draw_index nVar4;
  nk_vec2 local_88;
  float local_78;
  float fStack_74;
  nk_colorf col_bottom;
  nk_colorf col_right;
  nk_colorf col_top;
  nk_colorf col_left;
  
  nk_color_fv(&col_left.r,left);
  nk_color_fv(&col_right.r,right);
  nk_color_fv(&col_top.r,top);
  nk_color_fv(&col_bottom.r,bottom);
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x27df,
                  "void nk_draw_list_fill_rect_multi_color(struct nk_draw_list *, struct nk_rect, struct nk_color, struct nk_color, struct nk_color, struct nk_color)"
                 );
  }
  nk_draw_list_push_image(list,(list->config).null.texture);
  uVar1 = list->vertex_count;
  pvVar2 = nk_draw_list_alloc_vertices(list,4);
  pnVar3 = nk_draw_list_alloc_elements(list,6);
  if (pnVar3 != (nk_draw_index *)0x0 && pvVar2 != (void *)0x0) {
    config = &list->config;
    nVar4 = (nk_draw_index)uVar1;
    *pnVar3 = nVar4;
    pnVar3[1] = nVar4 + 1;
    pnVar3[2] = nVar4 + 2;
    pnVar3[3] = nVar4;
    pnVar3[4] = nVar4 + 2;
    pnVar3[5] = nVar4 + 3;
    pvVar2 = nk_draw_vertex(pvVar2,config,rect._0_8_,(list->config).null.uv,col_left);
    local_88.x = rect.w;
    local_88.y = rect.h;
    local_78 = rect.x;
    fStack_74 = rect.y;
    local_88.x = local_88.x + local_78;
    local_88.y = local_88.y + fStack_74;
    pos.y = fStack_74;
    pos.x = local_88.x;
    pvVar2 = nk_draw_vertex(pvVar2,config,pos,(list->config).null.uv,col_top);
    pvVar2 = nk_draw_vertex(pvVar2,config,local_88,(list->config).null.uv,col_right);
    pos_00.y = local_88.y;
    pos_00.x = local_78;
    nk_draw_vertex(pvVar2,config,pos_00,(list->config).null.uv,col_bottom);
    return;
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_rect_multi_color(struct nk_draw_list *list, struct nk_rect rect,
    struct nk_color left, struct nk_color top, struct nk_color right,
    struct nk_color bottom)
{
    void *vtx;
    struct nk_colorf col_left, col_top;
    struct nk_colorf col_right, col_bottom;
    nk_draw_index *idx;
    nk_draw_index index;

    nk_color_fv(&col_left.r, left);
    nk_color_fv(&col_right.r, right);
    nk_color_fv(&col_top.r, top);
    nk_color_fv(&col_bottom.r, bottom);

    NK_ASSERT(list);
    if (!list) return;

    nk_draw_list_push_image(list, list->config.null.texture);
    index = (nk_draw_index)list->vertex_count;
    vtx = nk_draw_list_alloc_vertices(list, 4);
    idx = nk_draw_list_alloc_elements(list, 6);
    if (!vtx || !idx) return;

    idx[0] = (nk_draw_index)(index+0); idx[1] = (nk_draw_index)(index+1);
    idx[2] = (nk_draw_index)(index+2); idx[3] = (nk_draw_index)(index+0);
    idx[4] = (nk_draw_index)(index+2); idx[5] = (nk_draw_index)(index+3);

    vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x, rect.y), list->config.null.uv, col_left);
    vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x + rect.w, rect.y), list->config.null.uv, col_top);
    vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x + rect.w, rect.y + rect.h), list->config.null.uv, col_right);
    vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x, rect.y + rect.h), list->config.null.uv, col_bottom);
}